

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

void __thiscall
helics::CommonCore::setTranslatorOperator
          (CommonCore *this,InterfaceHandle translator,
          shared_ptr<helics::TranslatorOperator> *callbacks)

{
  atomic<unsigned_short> *paVar1;
  uint16_t exp;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  pair<helics::route_id,_helics::ActionMessage> *ppVar5;
  InvalidIdentifier *this_00;
  char *pcVar6;
  size_t sVar7;
  ushort uVar8;
  bool bVar9;
  string_view message;
  ActionMessage transOpUpdate;
  ActionMessage local_e0;
  
  if ((setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)::
       nullTranslator == '\0') &&
     (iVar4 = __cxa_guard_acquire(&setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)
                                   ::nullTranslator), iVar4 != 0)) {
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    (setTranslatorOperator::nullTranslator.
     super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_use_count = 1;
    (setTranslatorOperator::nullTranslator.
     super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _M_weak_count = 1;
    (setTranslatorOperator::nullTranslator.
     super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004ea898;
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (setTranslatorOperator::nullTranslator.
          super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)0x0;
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = 0;
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_weak_count = 0;
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = 1;
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_weak_count = 0;
    setTranslatorOperator::nullTranslator.
    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _vptr__Sp_counted_base = (_func_int **)&PTR__TranslatorOperator_004ea8e8;
    __cxa_atexit(std::__shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>::
                 ~__shared_ptr,&setTranslatorOperator::nullTranslator,&__dso_handle);
    __cxa_guard_release(&setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)
                         ::nullTranslator);
  }
  ppVar5 = getHandleInfo(this,translator);
  if (ppVar5 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "translator handle is not valid";
    sVar7 = 0x1e;
  }
  else {
    if ((char)(ppVar5->second).messageID == 't') {
      ActionMessage::ActionMessage(&local_e0,cmd_core_configure);
      local_e0.messageID = 0x23e;
      if ((callbacks->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == (element_type *)0x0) {
        (callbacks->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = setTranslatorOperator::nullTranslator.
                 super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(callbacks->
                    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount,
                   &setTranslatorOperator::nullTranslator.
                    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      LOCK();
      paVar1 = &this->nextAirLock;
      uVar8 = (paVar1->super___atomic_base<unsigned_short>)._M_i;
      (paVar1->super___atomic_base<unsigned_short>)._M_i =
           (paVar1->super___atomic_base<unsigned_short>)._M_i + 1;
      UNLOCK();
      uVar8 = uVar8 & 3;
      if (uVar8 == 3) {
        uVar2 = 4;
        do {
          LOCK();
          uVar3 = (this->nextAirLock).super___atomic_base<unsigned_short>._M_i;
          bVar9 = uVar2 == uVar3;
          if (bVar9) {
            (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = uVar2 & 3;
            uVar3 = uVar2;
          }
          UNLOCK();
        } while ((!bVar9) && (uVar2 = uVar3, 3 < uVar3));
      }
      gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
      load<std::shared_ptr<helics::TranslatorOperator>>
                ((AirLock<std::any,std::mutex,std::condition_variable> *)
                 ((this->dataAirlocks)._M_elems + uVar8),callbacks);
      local_e0.source_id.gid = (ppVar5->first).rid;
      local_e0.source_handle.hid = translator.hid;
      local_e0.counter = uVar8;
      gmlc::containers::
      BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &(this->super_BrokerBase).actionQueue,&local_e0);
      ActionMessage::~ActionMessage(&local_e0);
      return;
    }
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar6 = "translator identifier does not point to a valid translator";
    sVar7 = 0x3a;
  }
  message._M_str = pcVar6;
  message._M_len = sVar7;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setTranslatorOperator(InterfaceHandle translator,
                                       std::shared_ptr<TranslatorOperator> callbacks)
{
    static const std::shared_ptr<TranslatorOperator> nullTranslator =
        std::make_shared<NullTranslatorOperator>();
    const auto* hndl = getHandleInfo(translator);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("translator handle is not valid"));
    }
    if ((hndl->handleType != InterfaceType::TRANSLATOR)) {
        throw(InvalidIdentifier("translator identifier does not point to a valid translator"));
    }
    ActionMessage transOpUpdate(CMD_CORE_CONFIGURE);
    transOpUpdate.messageID = UPDATE_TRANSLATOR_OPERATOR;
    if (!callbacks) {
        callbacks = nullTranslator;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callbacks));
    transOpUpdate.counter = index;
    transOpUpdate.source_id = hndl->getFederateId();
    transOpUpdate.source_handle = translator;
    actionQueue.push(transOpUpdate);
}